

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeConcepts.hh
# Opt level: O3

void __thiscall
avro::concepts::SingleAttribute<avro::Name>::SingleAttribute
          (SingleAttribute<avro::Name> *this,SingleAttribute<avro::Name> *rhs)

{
  pointer pcVar1;
  
  (this->attr_).ns_._M_dataplus._M_p = (pointer)&(this->attr_).ns_.field_2;
  pcVar1 = (rhs->attr_).ns_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (rhs->attr_).ns_._M_string_length);
  (this->attr_).simpleName_._M_dataplus._M_p = (pointer)&(this->attr_).simpleName_.field_2;
  pcVar1 = (rhs->attr_).simpleName_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->attr_).simpleName_,pcVar1,
             pcVar1 + (rhs->attr_).simpleName_._M_string_length);
  return;
}

Assistant:

SingleAttribute(const SingleAttribute<Attribute> &rhs) : 
        attr_(rhs.attr_)
    { }